

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

Type * slang::ast::Type::getPredefinedType(Compilation *compilation,SyntaxKind kind,bool isSigned)

{
  byte in_DL;
  bool *in_RDI;
  IntegralType *predef;
  undefined3 in_stack_00000020;
  bool *in_stack_ffffffffffffffd0;
  Kind *in_stack_ffffffffffffffd8;
  PredefinedIntegerType *local_8;
  
  Compilation::getType((Compilation *)CONCAT44(kind,_in_stack_00000020),predef._4_4_);
  local_8 = (PredefinedIntegerType *)Symbol::as<slang::ast::IntegralType>((Symbol *)0xa1263b);
  if ((in_DL & 1) != ((local_8->super_IntegralType).isSigned & 1U)) {
    if ((local_8->super_IntegralType).super_Type.super_Symbol.kind == ScalarType) {
      Symbol::as<slang::ast::ScalarType>((Symbol *)0xa12685);
      local_8 = (PredefinedIntegerType *)
                BumpAllocator::
                emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind_const&,bool&>
                          ((BumpAllocator *)local_8,(Kind *)in_RDI,in_stack_ffffffffffffffd0);
    }
    else {
      Symbol::as<slang::ast::PredefinedIntegerType>((Symbol *)0xa126b6);
      local_8 = BumpAllocator::
                emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind_const&,bool&>
                          ((BumpAllocator *)local_8,in_stack_ffffffffffffffd8,in_RDI);
    }
  }
  return (Type *)local_8;
}

Assistant:

const Type& Type::getPredefinedType(Compilation& compilation, SyntaxKind kind, bool isSigned) {
    auto& predef = compilation.getType(kind).as<IntegralType>();
    if (isSigned == predef.isSigned)
        return predef;

    if (predef.kind == SymbolKind::ScalarType)
        return *compilation.emplace<ScalarType>(predef.as<ScalarType>().scalarKind, isSigned);

    return *compilation.emplace<PredefinedIntegerType>(
        predef.as<PredefinedIntegerType>().integerKind, isSigned);
}